

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O0

uint32_t union_vector16(uint16_t *array1,uint32_t length1,uint16_t *array2,uint32_t length2,
                       uint16_t *output)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  uint in_ECX;
  __m128i *palVar9;
  undefined1 (*in_RDX) [16];
  longlong extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong lVar10;
  uint in_ESI;
  __m128i *palVar11;
  undefined1 (*in_RDI) [16];
  uint16_t *in_R8;
  __m128i old;
  __m128i old_00;
  __m128i old_01;
  __m128i old_02;
  __m128i newval;
  __m128i newval_00;
  __m128i newval_01;
  __m128i newval_02;
  uint32_t leftoversize;
  uint16_t buffer [16];
  uint32_t len;
  uint16_t curB;
  uint16_t curA;
  uint32_t pos2;
  uint32_t pos1;
  uint32_t len2;
  uint32_t len1;
  uint16_t *initoutput;
  __m128i laststore;
  __m128i vecMax;
  __m128i vecMin;
  __m128i V;
  __m128i vB;
  __m128i vA;
  uint16_t local_128 [16];
  undefined4 in_stack_fffffffffffffef8;
  ushort in_stack_fffffffffffffefc;
  ushort in_stack_fffffffffffffefe;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  size_t in_stack_ffffffffffffff10;
  uint16_t *size_1;
  uint16_t *in_stack_ffffffffffffff18;
  uint16_t *set_1;
  longlong local_d8 [2];
  uint16_t *local_c8 [2];
  __m128i local_b8;
  __m128i local_a8;
  __m128i local_98;
  uint16_t *local_80;
  uint local_74;
  undefined1 (*local_70) [16];
  uint local_64;
  undefined1 (*local_60) [16];
  uint32_t local_54;
  undefined1 (*local_50) [16];
  undefined1 (*local_48) [16];
  undefined2 local_2a;
  undefined1 local_28 [16];
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  longlong extraout_RDX_00;
  longlong extraout_RDX_03;
  
  if ((in_ESI < 8) || (in_ECX < 8)) {
    sVar8 = union_uint16(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                         (uint16_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                         CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                         (uint16_t *)
                         CONCAT26(in_stack_fffffffffffffefe,
                                  CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
    return (uint32_t)sVar8;
  }
  uVar2 = in_ESI >> 3;
  uVar3 = in_ECX >> 3;
  local_98 = (__m128i)vlddqu_avx(*in_RDI);
  uVar4 = 1;
  local_a8 = (__m128i)vlddqu_avx(*in_RDX);
  uVar5 = 1;
  palVar11 = &local_a8;
  palVar9 = &local_d8;
  size_1 = in_R8;
  local_80 = in_R8;
  local_74 = in_ECX;
  local_70 = in_RDX;
  local_64 = in_ESI;
  local_60 = in_RDI;
  sse_merge(&local_98,palVar11,(__m128i *)local_c8,palVar9);
  local_2a = 0xffff;
  local_2 = 0xffff;
  local_4 = 0xffff;
  local_6 = 0xffff;
  local_8 = 0xffff;
  local_a = 0xffff;
  local_c = 0xffff;
  local_e = 0xffff;
  local_10 = 0xffff;
  auVar1 = vpinsrw_avx(ZEXT216(0xffff),0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,0xffff,6);
  local_28 = vpinsrw_avx(auVar1,0xffff,7);
  old[1] = (longlong)palVar11;
  old[0] = (longlong)local_80;
  newval[1] = (longlong)palVar9;
  newval[0] = extraout_RDX;
  iVar6 = store_unique(old,newval,in_R8);
  local_80 = local_80 + iVar6;
  lVar10 = extraout_RDX_00;
  set_1 = local_c8[0];
  if ((uVar4 < uVar2) && (uVar5 < uVar3)) {
    in_stack_fffffffffffffefe = *(ushort *)(*local_60 + (ulong)(uVar4 << 3) * 2);
    in_stack_fffffffffffffefc = *(ushort *)(*local_70 + (ulong)(uVar5 << 3) * 2);
    do {
      if (in_stack_fffffffffffffefc < in_stack_fffffffffffffefe) {
        local_50 = local_70 + uVar5;
        local_b8 = (__m128i)vlddqu_avx(*local_50);
        uVar5 = uVar5 + 1;
        if (uVar3 <= uVar5) goto LAB_00107ba8;
        in_stack_fffffffffffffefc = *(ushort *)(*local_70 + (ulong)(uVar5 * 8) * 2);
      }
      else {
        local_48 = local_60 + uVar4;
        local_b8 = (__m128i)vlddqu_avx(*local_48);
        uVar4 = uVar4 + 1;
        if (uVar2 <= uVar4) goto LAB_00107ba8;
        in_stack_fffffffffffffefe = *(ushort *)(*local_60 + (ulong)(uVar4 * 8) * 2);
      }
      palVar9 = &local_d8;
      palVar11 = palVar9;
      sse_merge(&local_b8,palVar9,(__m128i *)local_c8,palVar9);
      old_00[1] = (longlong)palVar11;
      old_00[0] = (longlong)local_80;
      newval_00[1] = (longlong)palVar9;
      newval_00[0] = extraout_RDX_01;
      iVar6 = store_unique(old_00,newval_00,in_R8);
      local_80 = local_80 + iVar6;
    } while( true );
  }
LAB_00107c02:
  iVar6 = (int)((long)local_80 - (long)size_1 >> 1);
  old_02[1] = (longlong)palVar11;
  old_02[0] = (longlong)local_128;
  newval_02[1] = (longlong)size_1;
  newval_02[0] = lVar10;
  uVar7 = store_unique(old_02,newval_02,in_R8);
  if (uVar4 == uVar2) {
    memcpy(local_128 + uVar7,*local_60 + (ulong)(uVar4 << 3) * 2,(ulong)(local_64 + uVar2 * -8) << 1
          );
    uVar7 = local_64 + uVar2 * -8 + uVar7;
    qsort(local_128,(ulong)uVar7,2,uint16_compare);
    unique(local_128,uVar7);
    sVar8 = union_uint16(set_1,(size_t)size_1,(uint16_t *)CONCAT44(uVar2,uVar3),
                         CONCAT44(uVar4,uVar5),
                         (uint16_t *)
                         CONCAT26(in_stack_fffffffffffffefe,
                                  CONCAT24(in_stack_fffffffffffffefc,iVar6)));
    local_54 = (int)sVar8 + iVar6;
  }
  else {
    memcpy(local_128 + uVar7,*local_70 + (ulong)(uVar5 << 3) * 2,(ulong)(local_74 + uVar3 * -8) << 1
          );
    uVar7 = local_74 + uVar3 * -8 + uVar7;
    qsort(local_128,(ulong)uVar7,2,uint16_compare);
    unique(local_128,uVar7);
    sVar8 = union_uint16(set_1,(size_t)size_1,(uint16_t *)CONCAT44(uVar2,uVar3),
                         CONCAT44(uVar4,uVar5),
                         (uint16_t *)
                         CONCAT26(in_stack_fffffffffffffefe,
                                  CONCAT24(in_stack_fffffffffffffefc,iVar6)));
    local_54 = (int)sVar8 + iVar6;
  }
  return local_54;
LAB_00107ba8:
  palVar9 = &local_d8;
  palVar11 = palVar9;
  sse_merge(&local_b8,palVar9,(__m128i *)local_c8,palVar9);
  old_01[1] = (longlong)palVar11;
  old_01[0] = (longlong)local_80;
  newval_01[1] = (longlong)palVar9;
  newval_01[0] = extraout_RDX_02;
  iVar6 = store_unique(old_01,newval_01,in_R8);
  local_80 = local_80 + iVar6;
  lVar10 = extraout_RDX_03;
  set_1 = local_c8[0];
  goto LAB_00107c02;
}

Assistant:

CROARING_TARGET_AVX2
// a one-pass SSE union algorithm
// This function may not be safe if array1 == output or array2 == output.
uint32_t union_vector16(const uint16_t *__restrict__ array1, uint32_t length1,
                        const uint16_t *__restrict__ array2, uint32_t length2,
                        uint16_t *__restrict__ output) {
    if ((length1 < 8) || (length2 < 8)) {
        return (uint32_t)union_uint16(array1, length1, array2, length2, output);
    }
    __m128i vA, vB, V, vecMin, vecMax;
    __m128i laststore;
    uint16_t *initoutput = output;
    uint32_t len1 = length1 / 8;
    uint32_t len2 = length2 / 8;
    uint32_t pos1 = 0;
    uint32_t pos2 = 0;
    // we start the machine
    vA = _mm_lddqu_si128((const __m128i *)array1 + pos1);
    pos1++;
    vB = _mm_lddqu_si128((const __m128i *)array2 + pos2);
    pos2++;
    sse_merge(&vA, &vB, &vecMin, &vecMax);
    laststore = _mm_set1_epi16(-1);
    output += store_unique(laststore, vecMin, output);
    laststore = vecMin;
    if ((pos1 < len1) && (pos2 < len2)) {
        uint16_t curA, curB;
        curA = array1[8 * pos1];
        curB = array2[8 * pos2];
        while (true) {
            if (curA <= curB) {
                V = _mm_lddqu_si128((const __m128i *)array1 + pos1);
                pos1++;
                if (pos1 < len1) {
                    curA = array1[8 * pos1];
                } else {
                    break;
                }
            } else {
                V = _mm_lddqu_si128((const __m128i *)array2 + pos2);
                pos2++;
                if (pos2 < len2) {
                    curB = array2[8 * pos2];
                } else {
                    break;
                }
            }
            sse_merge(&V, &vecMax, &vecMin, &vecMax);
            output += store_unique(laststore, vecMin, output);
            laststore = vecMin;
        }
        sse_merge(&V, &vecMax, &vecMin, &vecMax);
        output += store_unique(laststore, vecMin, output);
        laststore = vecMin;
    }
    // we finish the rest off using a scalar algorithm
    // could be improved?
    //
    // copy the small end on a tmp buffer
    uint32_t len = (uint32_t)(output - initoutput);
    uint16_t buffer[16];
    uint32_t leftoversize = store_unique(laststore, vecMax, buffer);
    if (pos1 == len1) {
        memcpy(buffer + leftoversize, array1 + 8 * pos1,
               (length1 - 8 * len1) * sizeof(uint16_t));
        leftoversize += length1 - 8 * len1;
        qsort(buffer, leftoversize, sizeof(uint16_t), uint16_compare);

        leftoversize = unique(buffer, leftoversize);
        len += (uint32_t)union_uint16(buffer, leftoversize, array2 + 8 * pos2,
                                      length2 - 8 * pos2, output);
    } else {
        memcpy(buffer + leftoversize, array2 + 8 * pos2,
               (length2 - 8 * len2) * sizeof(uint16_t));
        leftoversize += length2 - 8 * len2;
        qsort(buffer, leftoversize, sizeof(uint16_t), uint16_compare);
        leftoversize = unique(buffer, leftoversize);
        len += (uint32_t)union_uint16(buffer, leftoversize, array1 + 8 * pos1,
                                      length1 - 8 * pos1, output);
    }
    return len;
}